

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.c
# Opt level: O0

ZyanStatus ZyanVectorShiftRight(ZyanVector *vector,ZyanUSize index,ZyanUSize count)

{
  ZyanUSize size;
  void *dest;
  void *source;
  ZyanUSize count_local;
  ZyanUSize index_local;
  ZyanVector *vector_local;
  
  if (vector == (ZyanVector *)0x0) {
    __assert_fail("vector",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/dependencies/zycore/src/Vector.c"
                  ,0x9d,"ZyanStatus ZyanVectorShiftRight(ZyanVector *, ZyanUSize, ZyanUSize)");
  }
  if (vector->element_size == 0) {
    __assert_fail("vector->element_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/dependencies/zycore/src/Vector.c"
                  ,0x9e,"ZyanStatus ZyanVectorShiftRight(ZyanVector *, ZyanUSize, ZyanUSize)");
  }
  if (vector->data == (void *)0x0) {
    __assert_fail("vector->data",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/dependencies/zycore/src/Vector.c"
                  ,0x9f,"ZyanStatus ZyanVectorShiftRight(ZyanVector *, ZyanUSize, ZyanUSize)");
  }
  if (count != 0) {
    if (vector->size + count <= vector->capacity) {
      memmove((void *)((long)vector->data + (index + count) * vector->element_size),
              (void *)((long)vector->data + index * vector->element_size),
              (vector->size - index) * vector->element_size);
      return 0x100000;
    }
    __assert_fail("vector->size + count <= vector->capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/dependencies/zycore/src/Vector.c"
                  ,0xa1,"ZyanStatus ZyanVectorShiftRight(ZyanVector *, ZyanUSize, ZyanUSize)");
  }
  __assert_fail("count > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/dependencies/zycore/src/Vector.c"
                ,0xa0,"ZyanStatus ZyanVectorShiftRight(ZyanVector *, ZyanUSize, ZyanUSize)");
}

Assistant:

static ZyanStatus ZyanVectorShiftRight(ZyanVector* vector, ZyanUSize index, ZyanUSize count)
{
    ZYAN_ASSERT(vector);
    ZYAN_ASSERT(vector->element_size);
    ZYAN_ASSERT(vector->data);
    ZYAN_ASSERT(count > 0);
    ZYAN_ASSERT(vector->size + count <= vector->capacity);

    const void* const source = ZYCORE_VECTOR_OFFSET(vector, index);
    void* const dest         = ZYCORE_VECTOR_OFFSET(vector, index + count);
    const ZyanUSize size     = (vector->size - index) * vector->element_size;
    ZYAN_MEMMOVE(dest, source, size);

    return ZYAN_STATUS_SUCCESS;
}